

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O1

void __thiscall fmcalc::init_profile_rec(fmcalc *this,fm_profile *f)

{
  pointer ppVar1;
  int iVar2;
  uchar tc_id;
  long lVar3;
  ulong __new_size;
  profile_rec_new p;
  vector<tc_rec,_std::allocator<tc_rec>_> local_38;
  
  local_38.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = f->calcrule_id;
  lVar3 = 8;
  tc_id = '\0';
  switch(iVar2) {
  case 1:
  case 3:
  case 4:
  case 5:
  case 9:
  case 0xf:
  case 0x21:
    break;
  case 2:
  case 0x11:
  case 0x12:
    add_tc('\0',f->deductible1,&local_38);
    tc_id = '\x04';
    lVar3 = 0x18;
  case 0x22:
    add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),&local_38);
    add_tc('\x06',f->share1,&local_38);
    tc_id = '\x03';
    lVar3 = 0x14;
  case 6:
  case 0xc:
  case 0x10:
  case 0x14:
    goto switchD_0010dd05_caseD_6;
  case 7:
  case 0x1a:
  case 0x23:
  case 0x24:
    add_tc('\0',f->deductible1,&local_38);
    add_tc('\x01',f->deductible2,&local_38);
    tc_id = '\x02';
    lVar3 = 0x10;
    break;
  case 8:
    add_tc('\0',f->deductible1,&local_38);
    tc_id = '\x01';
    lVar3 = 0xc;
    break;
  case 10:
    goto switchD_0010dd05_caseD_a;
  case 0xb:
    add_tc('\0',f->deductible1,&local_38);
    tc_id = '\x01';
    lVar3 = 0xc;
    goto switchD_0010dd05_caseD_6;
  case 0xd:
  case 0x13:
  case 0x15:
    add_tc('\0',f->deductible1,&local_38);
    tc_id = '\x01';
    lVar3 = 0xc;
    goto switchD_0010dd05_caseD_a;
  case 0xe:
    goto switchD_0010dd05_caseD_e;
  default:
    add_tc('\0',f->deductible1,&local_38);
    add_tc('\x01',f->deductible2,&local_38);
    add_tc('\x02',f->deductible3,&local_38);
    add_tc('\x03',f->attachment,&local_38);
    add_tc('\x04',f->limit,&local_38);
  case 0x19:
    add_tc('\x06',f->share1,&local_38);
    add_tc('\a',f->share2,&local_38);
    tc_id = '\b';
    lVar3 = 0x24;
    goto switchD_0010dd05_caseD_6;
  case 0x17:
    goto switchD_0010dd05_caseD_17;
  case 0x18:
    add_tc('\x03',f->attachment,&local_38);
    add_tc('\x06',f->share1,&local_38);
    goto switchD_0010dd05_caseD_17;
  }
switchD_0010dd05_caseD_1:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),&local_38);
switchD_0010dd05_caseD_e:
  tc_id = '\x04';
  lVar3 = 0x18;
switchD_0010dd05_caseD_6:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),&local_38);
  __new_size = (long)f->profile_id + 1;
  if ((ulong)((long)(this->profile_vec_new_).
                    super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->profile_vec_new_).
                    super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) < __new_size) {
    std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::resize
              (&this->profile_vec_new_,__new_size);
  }
  ppVar1 = (this->profile_vec_new_).
           super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>._M_impl.
           super__Vector_impl_data._M_start + f->profile_id;
  ppVar1->calcrule_id = iVar2;
  ppVar1->step_id = 0xffffffff;
  std::vector<tc_rec,_std::allocator<tc_rec>_>::operator=(&ppVar1->tc_vec,&local_38);
  if (local_38.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
switchD_0010dd05_caseD_17:
  add_tc('\a',f->share2,&local_38);
  tc_id = '\b';
  lVar3 = 0x24;
  goto switchD_0010dd05_caseD_1;
switchD_0010dd05_caseD_a:
  add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),&local_38);
  tc_id = '\x02';
  lVar3 = 0x10;
  goto switchD_0010dd05_caseD_6;
}

Assistant:

void fmcalc::init_profile_rec(fm_profile &f)
{
	profile_rec_new p;
	p.calcrule_id = f.calcrule_id;
	switch (p.calcrule_id) {
		case 1:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 2:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 3:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 4:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 5:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 6:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 7:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 8:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 9:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 10:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 11:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			break;
		case 12:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 13:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 14:
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 15:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 16:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 17:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 18:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 19:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 20:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 21:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 23:
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 24:
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 25:
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			break;
		case 26:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 33:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 34:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 35:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 36:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		default:
		{
			//fprintf(stderr, "Found calrule %d\n", p.calcrule_id);
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
		}

	}
	if (profile_vec_new_.size() < (size_t)f.profile_id + 1) {
		profile_vec_new_.resize(f.profile_id + 1);
	}
	profile_vec_new_[f.profile_id] = p;
}